

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

BuildValue * __thiscall
anon_unknown.dwarf_60e82::SymlinkCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,SymlinkCommand *this,Node *node,BuildValue *value)

{
  FileInfo outputInfo;
  bool bVar1;
  FileInfo *__src;
  BuildValue *pBVar2;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  FileInfo info;
  BuildValue *value_local;
  Node *node_local;
  SymlinkCommand *this_local;
  
  pBVar2 = __return_storage_ptr__;
  info.checksum.bytes._24_8_ = value;
  bVar1 = llbuild::buildsystem::BuildValue::isFailedCommand(value);
  if (((bVar1) ||
      (bVar1 = llbuild::buildsystem::BuildValue::isPropagatedFailureCommand
                         ((BuildValue *)info.checksum.bytes._24_8_), bVar1)) ||
     (bVar1 = llbuild::buildsystem::BuildValue::isCancelledCommand
                        ((BuildValue *)info.checksum.bytes._24_8_), bVar1)) {
    llbuild::buildsystem::BuildValue::makeFailedInput();
    return __return_storage_ptr__;
  }
  bVar1 = llbuild::buildsystem::BuildValue::isSkippedCommand
                    ((BuildValue *)info.checksum.bytes._24_8_);
  if (bVar1) {
    llbuild::buildsystem::BuildValue::makeSkippedCommand();
    return __return_storage_ptr__;
  }
  bVar1 = llbuild::buildsystem::BuildValue::isSuccessfulCommand
                    ((BuildValue *)info.checksum.bytes._24_8_);
  if (bVar1) {
    __src = llbuild::buildsystem::BuildValue::getOutputInfo
                      ((BuildValue *)info.checksum.bytes._24_8_);
    memcpy(local_78,__src,0x50);
    bVar1 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_78);
    if (!bVar1) {
      memcpy(local_c8,local_78,0x50);
      outputInfo.inode = local_b8;
      outputInfo.device = uStack_c0;
      outputInfo.mode = uStack_b0;
      outputInfo.size = local_a8;
      outputInfo.modTime.seconds = uStack_a0;
      outputInfo.modTime.nanoseconds = local_98;
      outputInfo.checksum.bytes[0] = (undefined1)uStack_90;
      outputInfo.checksum.bytes[1] = uStack_90._1_1_;
      outputInfo.checksum.bytes[2] = uStack_90._2_1_;
      outputInfo.checksum.bytes[3] = uStack_90._3_1_;
      outputInfo.checksum.bytes[4] = uStack_90._4_1_;
      outputInfo.checksum.bytes[5] = uStack_90._5_1_;
      outputInfo.checksum.bytes[6] = uStack_90._6_1_;
      outputInfo.checksum.bytes[7] = uStack_90._7_1_;
      outputInfo.checksum.bytes[8] = (undefined1)local_88;
      outputInfo.checksum.bytes[9] = local_88._1_1_;
      outputInfo.checksum.bytes[10] = local_88._2_1_;
      outputInfo.checksum.bytes[0xb] = local_88._3_1_;
      outputInfo.checksum.bytes[0xc] = local_88._4_1_;
      outputInfo.checksum.bytes[0xd] = local_88._5_1_;
      outputInfo.checksum.bytes[0xe] = local_88._6_1_;
      outputInfo.checksum.bytes[0xf] = local_88._7_1_;
      outputInfo.checksum.bytes[0x10] = (undefined1)uStack_80;
      outputInfo.checksum.bytes[0x11] = uStack_80._1_1_;
      outputInfo.checksum.bytes[0x12] = uStack_80._2_1_;
      outputInfo.checksum.bytes[0x13] = uStack_80._3_1_;
      outputInfo.checksum.bytes[0x14] = uStack_80._4_1_;
      outputInfo.checksum.bytes[0x15] = uStack_80._5_1_;
      outputInfo.checksum.bytes[0x16] = uStack_80._6_1_;
      outputInfo.checksum.bytes[0x17] = uStack_80._7_1_;
      outputInfo.checksum.bytes._24_8_ = pBVar2;
      llbuild::buildsystem::BuildValue::makeExistingInput(outputInfo);
      return __return_storage_ptr__;
    }
    llbuild::buildsystem::BuildValue::makeMissingOutput();
    return __return_storage_ptr__;
  }
  __assert_fail("value.isSuccessfulCommand()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                ,0xce2,
                "virtual BuildValue (anonymous namespace)::SymlinkCommand::getResultForOutput(Node *, const BuildValue &)"
               );
}

Assistant:

virtual BuildValue getResultForOutput(Node* node,
                                        const BuildValue& value) override {
    // If the value was a failed command, propagate the failure.
    if (value.isFailedCommand() || value.isPropagatedFailureCommand() ||
        value.isCancelledCommand())
      return BuildValue::makeFailedInput();
    if (value.isSkippedCommand())
      return BuildValue::makeSkippedCommand();

    // Otherwise, we should have a successful command -- return the actual
    // result for the output.
    assert(value.isSuccessfulCommand());

    auto info = value.getOutputInfo();
    if (info.isMissing())
        return BuildValue::makeMissingOutput();
    return BuildValue::makeExistingInput(info);
  }